

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

void __thiscall
chaiscript::exception::reserved_word_error::~reserved_word_error(reserved_word_error *this)

{
  ~reserved_word_error(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~reserved_word_error() noexcept override = default;